

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QLocaleId __thiscall QLocaleId::withLikelySubtagsAdded(QLocaleId *this)

{
  QLocaleId *pQVar1;
  ushort uVar2;
  undefined8 uVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  ushort uVar9;
  QLocaleId *pQVar10;
  difference_type __d;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  difference_type __d_2;
  ulong uVar15;
  difference_type __d_1;
  uint uVar16;
  bool bVar17;
  
  uVar5 = this->language_id;
  if (uVar5 == 0) {
    uVar8 = (ulong)this->territory_id;
    pQVar10 = likely_subtags;
  }
  else {
    pQVar10 = likely_subtags;
    uVar9 = this->territory_id;
    uVar8 = (ulong)uVar9;
    uVar7._0_2_ = this->language_id;
    uVar7._2_2_ = this->script_id;
    uVar14 = uVar7 & 0xffff;
    if (uVar14 == 0) {
      uVar14 = 0x10000;
    }
    uVar12 = (uint)uVar9;
    if (uVar8 == 0) {
      uVar12 = 0x10000;
    }
    uVar13 = 0x315;
    do {
      uVar11 = uVar13 >> 1;
      uVar15 = *(ulong *)(pQVar10 + uVar11 * 2);
      uVar16 = 0x10000;
      if ((uVar15 & 0xffff) != 0) {
        uVar16 = (uint)uVar15 & 0xffff;
      }
      bVar17 = uVar16 < uVar14;
      if (uVar16 == uVar14) {
        uVar16 = 0x10000;
        if ((uVar15 & 0xffff00000000) != 0) {
          uVar16 = (uint)(uVar15 >> 0x20) & 0xffff;
        }
        bVar17 = uVar16 < uVar12;
        if (uVar16 == uVar12) {
          bVar17 = (((uint)(uVar15 >> 0x10) & 0xffff) < uVar7 >> 0x10 || uVar7 < 0x10000) &&
                   0xffff < (uint)uVar15;
        }
      }
      if (bVar17) {
        pQVar10 = pQVar10 + uVar11 * 2 + 2;
        uVar11 = ~uVar11 + uVar13;
      }
      uVar13 = uVar11;
    } while (0 < (long)uVar11);
    for (; (pQVar10 < "en" && (pQVar10->language_id == uVar5)); pQVar10 = pQVar10 + 2) {
      uVar2 = pQVar10->territory_id;
      if (uVar2 == uVar9 || uVar2 == 0) {
        uVar6 = pQVar10->script_id;
        if ((uVar6 == 0) || (uVar6 == uVar7._2_2_)) {
          uVar14 = (uint)pQVar10[1].territory_id;
          if (uVar2 == 0) {
            uVar14 = (uint)uVar9;
          }
          if (uVar9 == 0) {
            uVar14 = (uint)pQVar10[1].territory_id;
          }
          uVar12 = (uint)pQVar10[1].script_id;
          if (uVar6 == 0) {
            uVar12 = uVar7 >> 0x10;
          }
          uVar13 = (ulong)uVar14;
          uVar9 = pQVar10[1].language_id;
          if (uVar7._2_2_ == 0) {
            uVar12 = (uint)pQVar10[1].script_id;
          }
          goto LAB_0011a99f;
        }
      }
    }
  }
  uVar7 = (uint)uVar8;
  uVar2 = this->script_id;
  uVar12 = (uint)uVar2;
  uVar6 = (ushort)uVar8;
  if (uVar6 != 0) {
    if (0 < (long)"en" - (long)pQVar10) {
      uVar13 = ((ulong)((long)"en" - (long)pQVar10) >> 2) * -0x5555555555555555;
      do {
        uVar11 = uVar13 >> 1;
        lVar4 = uVar11 * 2;
        uVar15 = *(ulong *)(pQVar10 + lVar4);
        if ((short)uVar15 == 0) {
          uVar14 = (uint)(uVar15 >> 0x20) & 0xffff;
          if ((uVar15 & 0xffff00000000) == 0) {
            uVar14 = 0x10000;
          }
          if (uVar14 == uVar7) {
            bVar17 = (((uint)(uVar15 >> 0x10) & 0xffff) < (uint)uVar2 || uVar2 == 0) &&
                     0xffff < (uint)uVar15;
            if (bVar17) {
LAB_0011a870:
              uVar11 = ~uVar11 + uVar13;
            }
          }
          else {
            bVar17 = uVar14 < uVar7;
            if (bVar17) goto LAB_0011a870;
          }
          if (bVar17) goto LAB_0011a87b;
        }
        else {
          uVar11 = ~uVar11 + uVar13;
LAB_0011a87b:
          pQVar10 = pQVar10 + lVar4 + 2;
        }
        uVar13 = uVar11;
      } while (0 < (long)uVar11);
    }
    for (; (pQVar10 < "en" && (pQVar10->territory_id == uVar6)); pQVar10 = pQVar10 + 2) {
      uVar9 = pQVar10->script_id;
      if ((uVar9 == 0) || (uVar9 == uVar2)) {
        if (uVar5 == 0) {
          uVar5 = pQVar10[1].language_id;
        }
        uVar7 = (uint)pQVar10[1].script_id;
        if (uVar9 == 0) {
          uVar7 = uVar12;
        }
        uVar13 = (ulong)pQVar10[1].territory_id;
        uVar9 = uVar5;
        uVar12 = uVar7;
        if (uVar2 == 0) {
          uVar12 = (uint)pQVar10[1].script_id;
        }
        goto LAB_0011a99f;
      }
    }
  }
  if (uVar2 == 0) {
    uVar12 = 0x42;
  }
  else {
    if (0 < (long)"en" - (long)pQVar10) {
      uVar13 = ((ulong)((long)"en" - (long)pQVar10) >> 2) * -0x5555555555555555;
      do {
        uVar15 = uVar13 >> 1;
        pQVar1 = pQVar10 + uVar15 * 2;
        uVar3 = *(undefined8 *)pQVar1;
        if ((short)uVar3 == 0 && (short)((ulong)uVar3 >> 0x20) == 0) {
          if (0xffff < (uint)uVar3 && ((uint)((ulong)uVar3 >> 0x10) & 0xffff) < (uint)uVar2) {
            pQVar10 = pQVar1 + 2;
            uVar15 = ~uVar15 + uVar13;
          }
        }
        else {
          pQVar10 = pQVar1 + 2;
          uVar15 = uVar13 + ~uVar15;
        }
        uVar13 = uVar15;
      } while (0 < (long)uVar15);
    }
    if ((pQVar10 < "en") && (pQVar10->script_id == uVar2)) {
      if (uVar5 == 0) {
        uVar5 = pQVar10[1].language_id;
      }
      if (uVar6 == 0) {
        uVar7 = (uint)pQVar10[1].territory_id;
      }
      uVar13 = (ulong)uVar7;
      uVar9 = uVar5;
      uVar12 = (uint)pQVar10[1].script_id;
      goto LAB_0011a99f;
    }
  }
  uVar9 = 0x4b;
  if (uVar5 != 0) {
    uVar9 = uVar5;
  }
  uVar13 = 0xf8;
  if (uVar6 != 0) {
    uVar13 = uVar8;
  }
LAB_0011a99f:
  return (QLocaleId)((uint6)uVar9 | (uint6)(uVar12 << 0x10) | (uint6)(uVar13 << 0x20));
}

Assistant:

QLocaleId QLocaleId::withLikelySubtagsAdded() const noexcept
{
    /* Each pattern that appears in a comments below, language_script_region and
       similar, indicates which of this's fields (even if blank) are being
       attended to in a given search; for fields left out of the pattern, the
       search uses 0 regardless of whether this has specified the field.

       If a key matches what we're searching for (possibly with a wildcard in
       the key matching a non-wildcard in our search), the tags from this that
       are specified in the key are replaced by the match (even if different);
       but the other tags of this replace what's in the match (even when the
       match does specify a value).

       Keep QLocaleXmlReader.__fillLikely() in sync with this, to ensure
       locale-appropriate time-zone naming works correctly.
    */
    static_assert(std::size(likely_subtags) % 2 == 0);
    auto *pairs = reinterpret_cast<const LikelyPair *>(likely_subtags);
    auto *const afterPairs = pairs + std::size(likely_subtags) / 2;
    LikelyPair sought { *this };
    // Our array is sorted in the order that puts all candidate matches in the
    // order we would want them; ones we should prefer appear before the others.
    if (language_id) {
        // language_script_region, language_region, language_script, language:
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Single language's block isn't long enough to warrant more binary
        // chopping within it - just traverse it all:
        for (; pairs < afterPairs && pairs->key.language_id == language_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            if (key.territory_id && key.territory_id != territory_id)
                continue;
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (territory_id && !key.territory_id)
                value.territory_id = territory_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script_region or und_region (in that order):
    if (territory_id) {
        sought.key = QLocaleId { 0, script_id, territory_id };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Again, individual und_?_region block isn't long enough to make binary
        // chop a win:
        for (; pairs < afterPairs && pairs->key.territory_id == territory_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            Q_ASSERT(!key.language_id);
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script:
    if (script_id) {
        sought.key = QLocaleId { 0, script_id, 0 };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        if (pairs < afterPairs && pairs->key.script_id == script_id) {
            Q_ASSERT(!pairs->key.language_id && !pairs->key.territory_id);
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (territory_id)
                value.territory_id = territory_id;
            return value;
        }
    }
    // Finally, fall back to the match-all rule (if there is one):
    pairs = afterPairs - 1; // All other keys are < match-all.
    if (pairs->key.matchesAll()) {
        QLocaleId value = pairs->value;
        if (language_id)
            value.language_id = language_id;
        if (territory_id)
            value.territory_id = territory_id;
        if (script_id)
            value.script_id = script_id;
        return value;
    }
    return *this;
}